

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Types.h
# Opt level: O0

bool __thiscall glslang::TType::sameSpirvType(TType *this,TType *right)

{
  bool local_22;
  bool local_21;
  TType *right_local;
  TType *this_local;
  
  if ((this->spirvType != (TSpirvType *)0x0) ||
     (local_21 = true, right->spirvType != (TSpirvType *)0x0)) {
    local_22 = false;
    if ((this->spirvType != (TSpirvType *)0x0) &&
       (local_22 = false, right->spirvType != (TSpirvType *)0x0)) {
      local_22 = TSpirvType::operator==(this->spirvType,right->spirvType);
    }
    local_21 = local_22;
  }
  return local_21;
}

Assistant:

bool sameSpirvType(const TType& right) const
    {
        return ((spirvType == nullptr && right.spirvType == nullptr) ||
                (spirvType != nullptr && right.spirvType != nullptr && *spirvType == *right.spirvType));
    }